

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O2

void __thiscall chrono::ChArchiveExplorer::out(ChArchiveExplorer *this,ChNameValue<double> *bVal)

{
  pointer pbVar1;
  bool bVar2;
  ChValueSpecific<double> *this_00;
  ChValueSpecific<double> *local_20;
  
  if ((this->found != true) || (this->find_all == true)) {
    pbVar1 = (this->search_tokens).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->search_tokens).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) + -1 ==
        (long)this->tablevel) {
      bVar2 = MatchName(this,pbVar1 + this->tablevel,bVal->_name);
      if (bVar2) {
        this_00 = (ChValueSpecific<double> *)operator_new(0x38);
        ChValueSpecific<double>::ChValueSpecific(this_00,bVal->_value,bVal->_name,bVal->_flags);
        local_20 = this_00;
        std::vector<chrono::ChValue*,std::allocator<chrono::ChValue*>>::
        emplace_back<chrono::ChValue*>
                  ((vector<chrono::ChValue*,std::allocator<chrono::ChValue*>> *)&this->results,
                   (ChValue **)&local_20);
        this->found = true;
      }
    }
  }
  return;
}

Assistant:

virtual void out     (ChNameValue<double> bVal) {
            if (this->found && !this->find_all) return;
            if (this->tablevel != this->search_tokens.size()-1) return;
            if (this->MatchName(search_tokens[this->tablevel],bVal.name())) {
                this->results.push_back(new ChValueSpecific<double>(bVal.value(),bVal.name(),bVal.flags()));
                this->found = true;
            }
      }